

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  FILE *__stream;
  uint16_t uVar2;
  uint uVar3;
  int __fd;
  int iVar4;
  char *pcVar5;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  ssize_t err;
  char buf [1024];
  char *h;
  char *fn2;
  char *fn1;
  size_t fn2sz;
  size_t fn1sz;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *session;
  int rc;
  char *userauthlist;
  char *fingerprint;
  sockaddr_in sin;
  int auth_pw;
  int i;
  libssh2_socket_t sock;
  uint32_t hostaddr;
  char **argv_local;
  int argc_local;
  
  sin.sin_zero[0] = '\0';
  sin.sin_zero[1] = '\0';
  sin.sin_zero[2] = '\0';
  sin.sin_zero[3] = '\0';
  channel = (LIBSSH2_CHANNEL *)0x0;
  if (argc < 2) {
    i = htonl(0x7f000001);
  }
  else {
    i = inet_addr(argv[1]);
  }
  if (2 < argc) {
    username = argv[2];
  }
  if (3 < argc) {
    password = argv[3];
  }
  uVar3 = libssh2_init(0);
  if (uVar3 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar3);
    return 1;
  }
  __fd = socket(2,1,0);
  if (__fd == -1) {
    fprintf(_stderr,"failed to create socket.\n");
    session._4_4_ = 1;
  }
  else {
    fingerprint._0_2_ = 2;
    fingerprint._2_2_ = htons(0x16);
    __stream = _stderr;
    fingerprint._4_4_ = i;
    pcVar5 = inet_ntoa((in_addr)i);
    uVar2 = ntohs(fingerprint._2_2_);
    fprintf(__stream,"Connecting to %s:%d as user %s\n",pcVar5,(ulong)uVar2,username);
    iVar4 = connect(__fd,(sockaddr *)&fingerprint,0x10);
    session._4_4_ = 0;
    if (iVar4 == 0) {
      channel = (LIBSSH2_CHANNEL *)libssh2_session_init_ex(0,0,0);
      if (channel == (LIBSSH2_CHANNEL *)0x0) {
        fprintf(_stderr,"Could not initialize SSH session.\n");
      }
      else {
        libssh2_trace(channel,0xffffffff);
        session._4_4_ = libssh2_session_handshake(channel,__fd);
        if (session._4_4_ == 0) {
          session._4_4_ = 1;
          lVar6 = libssh2_hostkey_hash(channel,2);
          fprintf(_stderr,"Fingerprint: ");
          sin.sin_zero[4] = '\0';
          sin.sin_zero[5] = '\0';
          sin.sin_zero[6] = '\0';
          sin.sin_zero[7] = '\0';
          for (; (int)sin.sin_zero._4_4_ < 0x14; sin.sin_zero._4_4_ = sin.sin_zero._4_4_ + 1) {
            fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar6 + (int)sin.sin_zero._4_4_));
          }
          fprintf(_stderr,"\n");
          pcVar5 = username;
          sVar7 = strlen(username);
          pcVar5 = (char *)libssh2_userauth_list(channel,pcVar5,sVar7 & 0xffffffff);
          if (pcVar5 != (char *)0x0) {
            fprintf(_stderr,"Authentication methods: %s\n",pcVar5);
            pcVar8 = strstr(pcVar5,"password");
            if (pcVar8 != (char *)0x0) {
              sin.sin_zero._0_4_ = sin.sin_zero._0_4_ | 1;
            }
            pcVar8 = strstr(pcVar5,"keyboard-interactive");
            if (pcVar8 != (char *)0x0) {
              sin.sin_zero._0_4_ = sin.sin_zero._0_4_ | 2;
            }
            pcVar5 = strstr(pcVar5,"publickey");
            if (pcVar5 != (char *)0x0) {
              sin.sin_zero._0_4_ = sin.sin_zero._0_4_ | 4;
            }
            if (4 < argc) {
              if (((sin.sin_zero._0_4_ & 1) != 0) && (iVar4 = strcmp(argv[4],"-p"), iVar4 == 0)) {
                sin.sin_zero[0] = '\x01';
                sin.sin_zero[1] = '\0';
                sin.sin_zero[2] = '\0';
                sin.sin_zero[3] = '\0';
              }
              if (((sin.sin_zero._0_4_ & 2) != 0) && (iVar4 = strcmp(argv[4],"-i"), iVar4 == 0)) {
                sin.sin_zero[0] = '\x02';
                sin.sin_zero[1] = '\0';
                sin.sin_zero[2] = '\0';
                sin.sin_zero[3] = '\0';
              }
              if (((sin.sin_zero._0_4_ & 4) != 0) && (iVar4 = strcmp(argv[4],"-k"), iVar4 == 0)) {
                sin.sin_zero[0] = '\x04';
                sin.sin_zero[1] = '\0';
                sin.sin_zero[2] = '\0';
                sin.sin_zero[3] = '\0';
              }
            }
            pcVar5 = username;
            if ((sin.sin_zero._0_4_ & 1) == 0) {
              if ((sin.sin_zero._0_4_ & 2) == 0) {
                if ((sin.sin_zero._0_4_ & 4) == 0) {
                  fprintf(_stderr,"No supported authentication methods found.\n");
                  goto LAB_00102c86;
                }
                buf._1016_8_ = getenv("HOME");
                if (((char *)buf._1016_8_ == (char *)0x0) || (*(char *)buf._1016_8_ == '\0')) {
                  buf._1016_8_ = anon_var_dwarf_1da;
                }
                sVar7 = strlen((char *)buf._1016_8_);
                sVar9 = strlen(pubkey);
                sVar7 = sVar7 + sVar9 + 2;
                sVar9 = strlen((char *)buf._1016_8_);
                sVar10 = strlen(privkey);
                sVar9 = sVar9 + sVar10 + 2;
                pcVar5 = (char *)malloc(sVar7);
                pcVar8 = (char *)malloc(sVar9);
                if ((pcVar5 == (char *)0x0) || (pcVar8 == (char *)0x0)) {
                  free(pcVar8);
                  free(pcVar5);
                  fprintf(_stderr,"out of memory\n");
                  goto LAB_00102c86;
                }
                snprintf(pcVar5,sVar7,"%s/%s",buf._1016_8_,pubkey);
                snprintf(pcVar8,sVar9,"%s/%s",buf._1016_8_,privkey);
                pcVar1 = username;
                sVar7 = strlen(username);
                iVar4 = libssh2_userauth_publickey_fromfile_ex
                                  (channel,pcVar1,sVar7 & 0xffffffff,pcVar5,pcVar8,password);
                if (iVar4 != 0) {
                  fprintf(_stderr,"Authentication by public key failed.\n");
                  free(pcVar8);
                  free(pcVar5);
                  goto LAB_00102c86;
                }
                fprintf(_stderr,"Authentication by public key succeeded.\n");
                free(pcVar8);
                free(pcVar5);
              }
              else {
                sVar7 = strlen(username);
                iVar4 = libssh2_userauth_keyboard_interactive_ex
                                  (channel,pcVar5,sVar7 & 0xffffffff,kbd_callback);
                if (iVar4 != 0) {
                  fprintf(_stderr,"Authentication by keyboard-interactive failed.\n");
                  goto LAB_00102c86;
                }
                fprintf(_stderr,"Authentication by keyboard-interactive succeeded.\n");
              }
            }
            else {
              sVar7 = strlen(username);
              pcVar8 = password;
              sVar9 = strlen(password);
              iVar4 = libssh2_userauth_password_ex
                                (channel,pcVar5,sVar7 & 0xffffffff,pcVar8,sVar9 & 0xffffffff,0);
              if (iVar4 != 0) {
                fprintf(_stderr,"Authentication by password failed.\n");
                goto LAB_00102c86;
              }
              fprintf(_stderr,"Authentication by password succeeded.\n");
            }
          }
          lVar6 = libssh2_channel_open_ex(channel,"session",7,0x200000,0x8000,0,0);
          if (lVar6 == 0) {
            fprintf(_stderr,"Unable to open a session\n");
          }
          else {
            libssh2_channel_setenv_ex(lVar6,"FOO",3,"bar");
            if (5 < argc) {
              pcVar5 = argv[5];
              sVar7 = strlen(argv[5]);
              iVar4 = libssh2_channel_process_startup(lVar6,"exec",4,pcVar5,sVar7 & 0xffffffff);
              if (iVar4 != 0) {
                fprintf(_stderr,"Unable to request command on channel\n");
                goto LAB_00102c86;
              }
              while (iVar4 = libssh2_channel_eof(lVar6), iVar4 == 0) {
                sVar7 = libssh2_channel_read_ex(lVar6,0,&err,0x400);
                if ((long)sVar7 < 0) {
                  fprintf(_stderr,"Unable to read response: %ld\n",sVar7);
                }
                else {
                  fwrite(&err,1,sVar7,_stdout);
                }
              }
            }
            session._4_4_ = libssh2_channel_get_exit_status(lVar6);
            iVar4 = libssh2_channel_close(lVar6);
            if (iVar4 != 0) {
              fprintf(_stderr,"Unable to close channel\n");
            }
            if (lVar6 != 0) {
              libssh2_channel_free(lVar6);
            }
          }
        }
        else {
          fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)session._4_4_);
        }
      }
    }
    else {
      fprintf(_stderr,"failed to connect.\n");
    }
  }
LAB_00102c86:
  if (channel != (LIBSSH2_CHANNEL *)0x0) {
    libssh2_session_disconnect_ex(channel,0xb,"Normal Shutdown","");
    libssh2_session_free(channel);
  }
  if (__fd != -1) {
    shutdown(__fd,2);
    close(__fd);
  }
  fprintf(_stderr,"all done\n");
  libssh2_exit();
  return session._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 0;
    struct sockaddr_in sin;
    const char *fingerprint;
    char *userauthlist;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        rc = 1;
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;

    fprintf(stderr, "Connecting to %s:%d as user %s\n",
            inet_ntoa(sin.sin_addr), ntohs(sin.sin_port), username);

    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance and start it up. This will trade welcome
     * banners, exchange keys, and setup crypto, compression, and MAC layers
     */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* Enable all debugging when libssh2 was built with debugging enabled */
    libssh2_trace(session, ~0);

    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    rc = 1;

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    /* check what authentication methods are available */
    userauthlist = libssh2_userauth_list(session, username,
                                         (unsigned int)strlen(username));
    if(userauthlist) {
        fprintf(stderr, "Authentication methods: %s\n", userauthlist);
        if(strstr(userauthlist, "password")) {
            auth_pw |= 1;
        }
        if(strstr(userauthlist, "keyboard-interactive")) {
            auth_pw |= 2;
        }
        if(strstr(userauthlist, "publickey")) {
            auth_pw |= 4;
        }

        /* check for options */
        if(argc > 4) {
            if((auth_pw & 1) && !strcmp(argv[4], "-p")) {
                auth_pw = 1;
            }
            if((auth_pw & 2) && !strcmp(argv[4], "-i")) {
                auth_pw = 2;
            }
            if((auth_pw & 4) && !strcmp(argv[4], "-k")) {
                auth_pw = 4;
            }
        }

        if(auth_pw & 1) {
            /* We could authenticate via password */
            if(libssh2_userauth_password(session, username, password)) {
                fprintf(stderr, "Authentication by password failed.\n");
                goto shutdown;
            }
            else {
                fprintf(stderr, "Authentication by password succeeded.\n");
            }
        }
        else if(auth_pw & 2) {
            /* Or via keyboard-interactive */
            if(libssh2_userauth_keyboard_interactive(session, username,
                                                     &kbd_callback) ) {
                fprintf(stderr,
                        "Authentication by keyboard-interactive failed.\n");
                goto shutdown;
            }
            else {
                fprintf(stderr,
                        "Authentication by keyboard-interactive succeeded.\n");
            }
        }
        else if(auth_pw & 4) {
            /* Or by public key */
            size_t fn1sz, fn2sz;
            char *fn1, *fn2;
            char const *h = getenv("HOME");
            if(!h || !*h)
                h = ".";
            fn1sz = strlen(h) + strlen(pubkey) + 2;
            fn2sz = strlen(h) + strlen(privkey) + 2;
            fn1 = malloc(fn1sz);
            fn2 = malloc(fn2sz);
            if(!fn1 || !fn2) {
                free(fn2);
                free(fn1);
                fprintf(stderr, "out of memory\n");
                goto shutdown;
            }
            /* Avoid false positives */
#if defined(__GNUC__) && __GNUC__ >= 7
#pragma GCC diagnostic push
#pragma GCC diagnostic warning "-Wformat-truncation=1"
#endif
            /* Using asprintf() here would be much cleaner,
               but less portable */
            snprintf(fn1, fn1sz, "%s/%s", h, pubkey);
            snprintf(fn2, fn2sz, "%s/%s", h, privkey);
#if defined(__GNUC__) && __GNUC__ >= 7
#pragma GCC diagnostic pop
#endif

            if(libssh2_userauth_publickey_fromfile(session, username,
                                                   fn1, fn2,
                                                   password)) {
                fprintf(stderr, "Authentication by public key failed.\n");
                free(fn2);
                free(fn1);
                goto shutdown;
            }
            else {
                fprintf(stderr, "Authentication by public key succeeded.\n");
            }
            free(fn2);
            free(fn1);
        }
        else {
            fprintf(stderr, "No supported authentication methods found.\n");
            goto shutdown;
        }
    }

    /* Request a session channel on which to run a shell */
    channel = libssh2_channel_open_session(session);
    if(!channel) {
        fprintf(stderr, "Unable to open a session\n");
        goto shutdown;
    }

    /* Some environment variables may be set,
     * It's up to the server which ones it'll allow though
     */
    libssh2_channel_setenv(channel, "FOO", "bar");

    /* Request a terminal with 'vanilla' terminal emulation
     * See /etc/termcap for more options. This is useful when opening
     * an interactive shell.
     */
    #if 0
    if(libssh2_channel_request_pty(channel, "vanilla")) {
        fprintf(stderr, "Failed requesting pty\n");
    }
    #endif

    if(argc > 5) {
        if(libssh2_channel_exec(channel, argv[5])) {
            fprintf(stderr, "Unable to request command on channel\n");
            goto shutdown;
        }
        /* Instead of just running a single command with libssh2_channel_exec,
         * a shell can be opened on the channel instead, for interactive use.
         * You usually want a pty allocated first in that case (see above). */
        #if 0
        if(libssh2_channel_shell(channel)) {
            fprintf(stderr, "Unable to request shell on allocated pty\n");
            goto shutdown;
        }
        #endif

        /* At this point the shell can be interacted with using
         * libssh2_channel_read()
         * libssh2_channel_read_stderr()
         * libssh2_channel_write()
         * libssh2_channel_write_stderr()
         *
         * Blocking mode may be (en|dis)abled with:
         *    libssh2_channel_set_blocking()
         * If the server send EOF, libssh2_channel_eof() will return non-0
         * To send EOF to the server use: libssh2_channel_send_eof()
         * A channel can be closed with: libssh2_channel_close()
         * A channel can be freed with: libssh2_channel_free()
         */

        /* Read and display all the data received on stdout (ignoring stderr)
         * until the channel closes. This will eventually block if the command
         * produces too much data on stderr; the loop must be rewritten to use
         * non-blocking mode and include interspersed calls to
         * libssh2_channel_read_stderr() to avoid this. See ssh2_echo.c for
         * an idea of how such a loop might look.
         */
        while(!libssh2_channel_eof(channel)) {
            char buf[1024];
            ssize_t err = libssh2_channel_read(channel, buf, sizeof(buf));
            if(err < 0)
                fprintf(stderr, "Unable to read response: %ld\n", (long)err);
            else {
                fwrite(buf, 1, (size_t)err, stdout);
            }
        }
    }

    rc = libssh2_channel_get_exit_status(channel);

    if(libssh2_channel_close(channel))
        fprintf(stderr, "Unable to close channel\n");

    if(channel) {
        libssh2_channel_free(channel);
        channel = NULL;
    }

    /* Other channel types are supported via:
     * libssh2_scp_send64()
     * libssh2_scp_recv2()
     * libssh2_channel_direct_tcpip()
     */

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return rc;
}